

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,LinkLibraryType llt)

{
  cmMakefile *pcVar1;
  cmTarget *pcVar2;
  MessageType t;
  TargetType TVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  size_type sVar8;
  cmake *this_00;
  reference pbVar9;
  TLLSignature signature;
  PolicyID id;
  bool bVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  const_iterator i_1;
  string local_3c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_398;
  const_iterator i;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  undefined1 local_350 [4];
  PolicyStatus policy22Status;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  string configLib;
  allocator local_259;
  string local_258;
  int local_234;
  string local_230;
  char *local_210;
  char *existingSig;
  MessageType local_1e4;
  char *pcStack_1e0;
  MessageType messageType;
  char *modal;
  ostringstream e;
  TLLSignature sig;
  allocator local_49;
  string local_48;
  LinkLibraryType local_24;
  string *psStack_20;
  LinkLibraryType llt_local;
  string *lib_local;
  cmTargetLinkLibrariesCommand *this_local;
  
  local_24 = llt;
  psStack_20 = lib;
  lib_local = (string *)this;
  TVar3 = cmTarget::GetType(this->Target);
  if ((TVar3 == INTERFACE_LIBRARY) &&
     (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,&local_49);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_0078c6eb;
  }
  bVar10 = true;
  if ((((this->CurrentProcessingState != ProcessingPlainPrivateInterface) &&
       (bVar10 = true, this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
      (bVar10 = true, this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
     (bVar10 = true, this->CurrentProcessingState != ProcessingKeywordPublicInterface)) {
    bVar10 = this->CurrentProcessingState == ProcessingKeywordLinkInterface;
  }
  signature = (TLLSignature)!bVar10;
  bVar10 = cmTarget::PushTLLCommandTrace(this->Target,signature);
  if (!bVar10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_1e0 = (char *)0x0;
    local_1e4 = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023);
    if (PVar4 != OLD) {
      if (PVar4 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&existingSig,(cmPolicies *)0x17,id);
        poVar5 = std::operator<<((ostream *)&modal,(string *)&existingSig);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&existingSig);
        pcStack_1e0 = "should";
      }
      else if (PVar4 - NEW < 3) {
        pcStack_1e0 = "must";
        local_1e4 = FATAL_ERROR;
      }
    }
    if (pcStack_1e0 == (char *)0x0) {
LAB_0078beea:
      local_234 = 0;
    }
    else {
      local_210 = "keyword";
      if (signature == KeywordTLLSignature) {
        local_210 = "plain";
      }
      poVar5 = std::operator<<((ostream *)&modal,"The ");
      poVar5 = std::operator<<(poVar5,local_210);
      poVar5 = std::operator<<(poVar5,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      psVar6 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\".  All uses of target_link_libraries with a target ");
      poVar5 = std::operator<<(poVar5,pcStack_1e0);
      std::operator<<(poVar5," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces
                (this->Target,(ostringstream *)&modal,(uint)(signature == KeywordTLLSignature));
      t = local_1e4;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,t,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      if (local_1e4 != FATAL_ERROR) goto LAB_0078beea;
      this_local._7_1_ = 0;
      local_234 = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    if (local_234 != 0) goto LAB_0078c6eb;
  }
  if ((this->CurrentProcessingState != ProcessingKeywordLinkInterface) &&
     (this->CurrentProcessingState != ProcessingPlainLinkInterface)) {
    pcVar1 = (this->super_cmCommand).Makefile;
    psVar6 = cmTarget::GetName_abi_cxx11_(this->Target);
    cmMakefile::AddLinkLibraryForTarget(pcVar1,psVar6,psStack_20,local_24);
    if (this->CurrentProcessingState == ProcessingLinkLibraries) {
      pcVar2 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,"INTERFACE_LINK_LIBRARIES",&local_259);
      cmTarget::GetDebugGeneratorExpressions
                ((string *)((long)&configLib.field_2 + 8),this->Target,psStack_20,local_24);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmTarget::AppendProperty(pcVar2,&local_258,pcVar7,false);
      std::__cxx11::string::~string((string *)(configLib.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      this_local._7_1_ = 1;
      goto LAB_0078c6eb;
    }
    if ((this->CurrentProcessingState != ProcessingKeywordPublicInterface) &&
       (this->CurrentProcessingState != ProcessingPlainPublicInterface)) {
      TVar3 = cmTarget::GetType(this->Target);
      if (TVar3 == STATIC_LIBRARY) {
        cmTarget::GetDebugGeneratorExpressions((string *)local_2a0,this->Target,psStack_20,local_24)
        ;
        bVar10 = cmGeneratorExpression::IsValidTargetName(psStack_20);
        if ((bVar10) ||
           (sVar8 = cmGeneratorExpression::Find(psStack_20), sVar8 != 0xffffffffffffffff)) {
          std::operator+(&local_2e0,"$<LINK_ONLY:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a0);
          std::operator+(&local_2c0,&local_2e0,">");
          std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
        }
        pcVar2 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_300,"INTERFACE_LINK_LIBRARIES",&local_301);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmTarget::AppendProperty(pcVar2,&local_300,pcVar7,false);
        std::__cxx11::string::~string((string *)&local_300);
        std::allocator<char>::~allocator((allocator<char> *)&local_301);
        std::__cxx11::string::~string((string *)local_2a0);
      }
      this_local._7_1_ = 1;
      goto LAB_0078c6eb;
    }
  }
  pcVar2 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"INTERFACE_LINK_LIBRARIES",&local_329);
  cmTarget::GetDebugGeneratorExpressions((string *)local_350,this->Target,psStack_20,local_24);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmTarget::AppendProperty(pcVar2,&local_328,pcVar7,false);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  PVar4 = cmTarget::GetPolicyStatusCMP0022(this->Target);
  if ((PVar4 == OLD) || (PVar4 == WARN)) {
    TVar3 = cmTarget::GetType(this->Target);
    if (TVar3 == INTERFACE_LIBRARY) {
      this_local._7_1_ = 1;
    }
    else {
      this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&prop.field_2 + 8),this_00);
      std::__cxx11::string::string((string *)&i);
      if ((local_24 == DEBUG) || (local_24 == GENERAL)) {
        local_3a0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_398,&local_3a0);
        while( true ) {
          local_3a8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
          bVar10 = __gnu_cxx::operator!=(&local_398,&local_3a8);
          if (!bVar10) break;
          std::__cxx11::string::operator=((string *)&i,"LINK_INTERFACE_LIBRARIES_");
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_398);
          std::__cxx11::string::operator+=((string *)&i,(string *)pbVar9);
          pcVar2 = this->Target;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmTarget::AppendProperty(pcVar2,(string *)&i,pcVar7,false);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_398);
        }
      }
      if ((local_24 == OPTIMIZED) || (local_24 == GENERAL)) {
        pcVar2 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3c8,"LINK_INTERFACE_LIBRARIES",
                   (allocator *)((long)&i_1._M_current + 7));
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmTarget::AppendProperty(pcVar2,&local_3c8,pcVar7,false);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
        local_3e0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_3d8,&local_3e0);
        while( true ) {
          local_3e8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
          bVar10 = __gnu_cxx::operator!=(&local_3d8,&local_3e8);
          if (!bVar10) break;
          std::__cxx11::string::operator=((string *)&i,"LINK_INTERFACE_LIBRARIES_");
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_3d8);
          std::__cxx11::string::operator+=((string *)&i,(string *)pbVar9);
          pcVar7 = cmTarget::GetProperty(this->Target,(string *)&i);
          if (pcVar7 == (char *)0x0) {
            cmTarget::SetProperty(this->Target,(string *)&i,"");
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_3d8);
        }
      }
      this_local._7_1_ = 1;
      local_234 = 1;
      std::__cxx11::string::~string((string *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&prop.field_2 + 8));
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_0078c6eb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                            cmTarget::LinkLibraryType llt)
{
  if(this->Target->GetType() == cmTarget::INTERFACE_LIBRARY
      && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
    }

  cmTarget::TLLSignature sig =
        (this->CurrentProcessingState == ProcessingPlainPrivateInterface
      || this->CurrentProcessingState == ProcessingPlainPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordPrivateInterface
      || this->CurrentProcessingState == ProcessingKeywordPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordLinkInterface)
        ? cmTarget::KeywordTLLSignature : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(sig))
    {
    std::ostringstream e;
    const char *modal = 0;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0023))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
      }

      if(modal)
        {
        // If the sig is a keyword form and there is a conflict, the existing
        // form must be the plain form.
        const char *existingSig
                    = (sig == cmTarget::KeywordTLLSignature ? "plain"
                                                            : "keyword");
          e <<
            "The " << existingSig << " signature for target_link_libraries "
            "has already been used with the target \""
          << this->Target->GetName() << "\".  All uses of "
             "target_link_libraries with a target " << modal << " be either "
             "all-keyword or all-plain.\n";
        this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
        this->Makefile->IssueMessage(messageType, e.str());
        if(messageType == cmake::FATAL_ERROR)
          {
          return false;
          }
        }
    }

  // Handle normal case first.
  if(this->CurrentProcessingState != ProcessingKeywordLinkInterface
      && this->CurrentProcessingState != ProcessingPlainLinkInterface)
    {
    this->Makefile
      ->AddLinkLibraryForTarget(this->Target->GetName(), lib, llt);
    if(this->CurrentProcessingState == ProcessingLinkLibraries)
      {
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
        this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());
      return true;
      }
    else if(this->CurrentProcessingState != ProcessingKeywordPublicInterface
            && this->CurrentProcessingState != ProcessingPlainPublicInterface)
      {
      if (this->Target->GetType() == cmTarget::STATIC_LIBRARY)
        {
        std::string configLib = this->Target
                                     ->GetDebugGeneratorExpressions(lib, llt);
        if (cmGeneratorExpression::IsValidTargetName(lib)
            || cmGeneratorExpression::Find(lib) != std::string::npos)
          {
          configLib = "$<LINK_ONLY:" + configLib + ">";
          }
        this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                     configLib.c_str());
        }
      // Not a 'public' or 'interface' library. Do not add to interface
      // property.
      return true;
      }
    }

  this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
              this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());

  const cmPolicies::PolicyStatus policy22Status
                      = this->Target->GetPolicyStatusCMP0022();

  if (policy22Status != cmPolicies::OLD
      && policy22Status != cmPolicies::WARN)
    {
    return true;
    }

  if (this->Target->GetType() == cmTarget::INTERFACE_LIBRARY)
    {
    return true;
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  std::string prop;

  // Include this library in the link interface for the target.
  if(llt == cmTarget::DEBUG || llt == cmTarget::GENERAL)
    {
    // Put in the DEBUG configuration interfaces.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      this->Target->AppendProperty(prop, lib.c_str());
      }
    }
  if(llt == cmTarget::OPTIMIZED || llt == cmTarget::GENERAL)
    {
    // Put in the non-DEBUG configuration interfaces.
    this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", lib.c_str());

    // Make sure the DEBUG configuration interfaces exist so that the
    // general one will not be used as a fall-back.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      if(!this->Target->GetProperty(prop))
        {
        this->Target->SetProperty(prop, "");
        }
      }
    }
  return true;
}